

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1driver.c
# Opt level: O0

FT_Long t1_ps_get_font_value
                  (FT_Face face,PS_Dict_Keys key,FT_UInt idx,void *value,FT_Long value_len_)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  FT_Face pFVar4;
  size_t *psVar5;
  size_t sVar6;
  bool bVar7;
  FT_ULong local_90;
  ulong local_70;
  size_t *val_2;
  FT_Face_Internal pFStack_58;
  FT_Bool ok;
  FT_Fixed val_1;
  FT_Fixed val;
  T1_Font type1;
  T1_Face t1face;
  FT_ULong value_len;
  FT_ULong retval;
  FT_Long value_len__local;
  void *value_local;
  FT_UInt idx_local;
  PS_Dict_Keys key_local;
  FT_Face face_local;
  
  value_len = 0;
  local_70 = value_len_;
  if (value_len_ < 0) {
    local_70 = 0;
  }
  pFVar4 = face + 1;
  switch(key) {
  case PS_DICT_FONT_TYPE:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[2].driver + 1);
    }
    break;
  case PS_DICT_FONT_MATRIX:
    if (idx < 4) {
      val_1 = 0;
      value_len = 8;
      if ((value != (void *)0x0) && (7 < local_70)) {
        switch(idx) {
        case 0:
          val_1 = (FT_Fixed)face[2].memory;
          break;
        case 1:
          val_1 = (FT_Fixed)face[2].stream;
          break;
        case 2:
          val_1 = (FT_Fixed)face[2].sizes_list.head;
          break;
        case 3:
          val_1 = (FT_Fixed)face[2].sizes_list.tail;
        }
        *(FT_Fixed *)value = val_1;
      }
    }
    break;
  case PS_DICT_FONT_BBOX:
    if (idx < 4) {
      pFStack_58 = (FT_Face_Internal)0x0;
      value_len = 8;
      if ((value != (void *)0x0) && (7 < local_70)) {
        switch(idx) {
        case 0:
          pFStack_58 = (FT_Face_Internal)face[2].extensions;
          break;
        case 1:
          pFStack_58 = face[2].internal;
          break;
        case 2:
          pFStack_58 = (FT_Face_Internal)face[3].num_faces;
          break;
        case 3:
          pFStack_58 = (FT_Face_Internal)face[3].face_index;
        }
        *(FT_Face_Internal *)value = pFStack_58;
      }
    }
    break;
  case PS_DICT_PAINT_TYPE:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)&face[2].driver;
    }
    break;
  case PS_DICT_FONT_NAME:
    if (face[2].family_name != (FT_String *)0x0) {
      sVar6 = strlen(face[2].family_name);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,face[2].family_name,value_len);
      }
    }
    break;
  case PS_DICT_UNIQUE_ID:
    value_len = 4;
    if ((value != (void *)0x0) && (3 < local_70)) {
      *(undefined4 *)value = *(undefined4 *)&face[1].available_sizes;
    }
    break;
  case PS_DICT_NUM_CHAR_STRINGS:
    value_len = 4;
    if ((value != (void *)0x0) && (3 < local_70)) {
      *(undefined4 *)value = *(undefined4 *)&face[2].max_advance_width;
    }
    break;
  case PS_DICT_CHAR_STRING_KEY:
    uVar1._0_2_ = face[2].max_advance_width;
    uVar1._2_2_ = face[2].max_advance_height;
    if (idx < uVar1) {
      sVar6 = strlen((char *)(&(face[2].glyph)->library)[idx]);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,(&(face[2].glyph)->library)[idx],value_len);
        *(undefined1 *)((long)value + sVar6) = 0;
      }
    }
    break;
  case PS_DICT_CHAR_STRING:
    uVar2._0_2_ = face[2].max_advance_width;
    uVar2._2_2_ = face[2].max_advance_height;
    if (((idx < uVar2) &&
        (value_len = (FT_ULong)(*(int *)((long)&(face[2].charmap)->face + (ulong)idx * 4) + 1),
        value != (void *)0x0)) && (value_len <= local_70)) {
      memcpy(value,(&(face[2].size)->face)[idx],value_len - 1);
      *(undefined1 *)((long)value + (value_len - 1)) = 0;
    }
    break;
  case PS_DICT_ENCODING_TYPE:
    value_len = 4;
    if ((value != (void *)0x0) && (3 < local_70)) {
      *(undefined4 *)value = *(undefined4 *)&face[2].style_name;
    }
    break;
  case PS_DICT_ENCODING_ENTRY:
    if ((*(int *)&face[2].style_name == 1) && (idx < (uint)face[2].num_fixed_sizes)) {
      sVar6 = strlen((char *)face[2].charmaps[idx]);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,face[2].charmaps[idx],sVar6);
        *(undefined1 *)((long)value + sVar6) = 0;
      }
    }
    break;
  case PS_DICT_NUM_SUBRS:
    value_len = 4;
    if ((value != (void *)0x0) && (3 < local_70)) {
      *(int *)value = (int)face[2].bbox.yMin;
    }
    break;
  case PS_DICT_SUBR:
    lVar3._0_2_ = face[2].units_per_EM;
    lVar3._2_2_ = face[2].ascender;
    lVar3._4_2_ = face[2].descender;
    lVar3._6_2_ = face[2].height;
    value_local._0_4_ = idx;
    if (lVar3 == 0) {
      bVar7 = idx < (uint)face[2].bbox.yMin;
    }
    else {
      psVar5 = ft_hash_num_lookup(idx,*(FT_Hash *)&face[2].units_per_EM);
      bVar7 = psVar5 != (size_t *)0x0;
      if (bVar7) {
        value_local._0_4_ = (FT_UInt)*psVar5;
      }
    }
    if ((((bVar7) && (face[2].bbox.xMax != 0)) &&
        (value_len = (FT_ULong)(*(int *)(face[2].bbox.yMax + (ulong)(FT_UInt)value_local * 4) + 1),
        value != (void *)0x0)) && (value_len <= local_70)) {
      memcpy(value,*(void **)(face[2].bbox.xMax + (ulong)(FT_UInt)value_local * 8),value_len - 1);
      *(undefined1 *)((long)value + (value_len - 1)) = 0;
    }
    break;
  case PS_DICT_STD_HW:
    value_len = 2;
    if ((value != (void *)0x0) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)&face[1].stream;
    }
    break;
  case PS_DICT_STD_VW:
    value_len = 2;
    if ((value != (void *)0x0) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].stream + 2);
    }
    break;
  case PS_DICT_NUM_BLUE_VALUES:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(char *)value = (char)face[1].num_charmaps;
    }
    break;
  case PS_DICT_BLUE_VALUE:
    if (((idx < (byte)face[1].num_charmaps) && (value_len = 2, value != (void *)0x0)) &&
       (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)(&face[1].field_0x4c + (ulong)idx * 2);
    }
    break;
  case PS_DICT_BLUE_FUZZ:
    value_len = 4;
    if ((value != (void *)0x0) && (3 < local_70)) {
      *(undefined4 *)value = *(undefined4 *)((long)&face[1].memory + 4);
    }
    break;
  case PS_DICT_NUM_OTHER_BLUES:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[1].num_charmaps + 1);
    }
    break;
  case PS_DICT_OTHER_BLUE:
    if (((idx < *(byte *)((long)&face[1].num_charmaps + 1)) && (value_len = 2, value != (void *)0x0)
        ) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].bbox.xMin + (ulong)idx * 2);
    }
    break;
  case PS_DICT_NUM_FAMILY_BLUES:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[1].num_charmaps + 2);
    }
    break;
  case PS_DICT_FAMILY_BLUE:
    if (((idx < *(byte *)((long)&face[1].num_charmaps + 2)) && (value_len = 2, value != (void *)0x0)
        ) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].bbox.xMax + (ulong)idx * 2 + 4);
    }
    break;
  case PS_DICT_NUM_FAMILY_OTHER_BLUES:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[1].num_charmaps + 3);
    }
    break;
  case PS_DICT_FAMILY_OTHER_BLUE:
    if (((idx < *(byte *)((long)&face[1].num_charmaps + 3)) && (value_len = 2, value != (void *)0x0)
        ) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].glyph + (ulong)idx * 2);
    }
    break;
  case PS_DICT_BLUE_SCALE:
    value_len = 8;
    if ((value != (void *)0x0) && (7 < local_70)) {
      *(FT_Driver *)value = face[1].driver;
    }
    break;
  case PS_DICT_BLUE_SHIFT:
    value_len = 4;
    if ((value != (void *)0x0) && (3 < local_70)) {
      *(undefined4 *)value = *(undefined4 *)&face[1].memory;
    }
    break;
  case PS_DICT_NUM_STEM_SNAP_H:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[1].stream + 4);
    }
    break;
  case PS_DICT_STEM_SNAP_H:
    if (((idx < *(byte *)((long)&face[1].stream + 4)) && (value_len = 2, value != (void *)0x0)) &&
       (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].sizes_list.head + (ulong)idx * 2);
    }
    break;
  case PS_DICT_NUM_STEM_SNAP_V:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[1].stream + 5);
    }
    break;
  case PS_DICT_STEM_SNAP_V:
    if (((idx < *(byte *)((long)&face[1].stream + 5)) && (value_len = 2, value != (void *)0x0)) &&
       (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].autohint.finalizer + (ulong)idx * 2 + 2)
      ;
    }
    break;
  case PS_DICT_FORCE_BOLD:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[1].stream + 6);
    }
    break;
  case PS_DICT_RND_STEM_UP:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)((long)&face[1].stream + 7);
    }
    break;
  case PS_DICT_MIN_FEATURE:
    if (((idx < 2) && (value_len = 2, value != (void *)0x0)) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[2].num_glyphs + (ulong)idx * 2);
    }
    break;
  case PS_DICT_LEN_IV:
    value_len = 4;
    if ((value != (void *)0x0) && (3 < local_70)) {
      *(undefined4 *)value = *(undefined4 *)((long)&face[1].available_sizes + 4);
    }
    break;
  case PS_DICT_PASSWORD:
    value_len = 8;
    if ((value != (void *)0x0) && (7 < local_70)) {
      *(FT_Long *)value = face[2].style_flags;
    }
    break;
  case PS_DICT_LANGUAGE_GROUP:
    value_len = 8;
    if ((value != (void *)0x0) && (7 < local_70)) {
      *(FT_Long *)value = face[2].face_flags;
    }
    break;
  case PS_DICT_VERSION:
    if (pFVar4->num_faces != 0) {
      sVar6 = strlen((char *)pFVar4->num_faces);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,(void *)pFVar4->num_faces,value_len);
      }
    }
    break;
  case PS_DICT_NOTICE:
    if (face[1].face_index != 0) {
      sVar6 = strlen((char *)face[1].face_index);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,(void *)face[1].face_index,value_len);
      }
    }
    break;
  case PS_DICT_FULL_NAME:
    if (face[1].face_flags != 0) {
      sVar6 = strlen((char *)face[1].face_flags);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,(void *)face[1].face_flags,value_len);
      }
    }
    break;
  case PS_DICT_FAMILY_NAME:
    if (face[1].style_flags != 0) {
      sVar6 = strlen((char *)face[1].style_flags);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,(void *)face[1].style_flags,value_len);
      }
    }
    break;
  case PS_DICT_WEIGHT:
    if (face[1].num_glyphs != 0) {
      sVar6 = strlen((char *)face[1].num_glyphs);
      value_len = sVar6 + 1;
      if ((value != (void *)0x0) && (value_len <= local_70)) {
        memcpy(value,(void *)face[1].num_glyphs,value_len);
      }
    }
    break;
  case PS_DICT_IS_FIXED_PITCH:
    value_len = 1;
    if ((value != (void *)0x0) && (local_70 != 0)) {
      *(undefined1 *)value = *(undefined1 *)&face[1].style_name;
    }
    break;
  case PS_DICT_UNDERLINE_POSITION:
    value_len = 2;
    if ((value != (void *)0x0) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].style_name + 2);
    }
    break;
  case PS_DICT_UNDERLINE_THICKNESS:
    value_len = 2;
    if ((value != (void *)0x0) && (1 < local_70)) {
      *(undefined2 *)value = *(undefined2 *)((long)&face[1].style_name + 4);
    }
    break;
  case PS_DICT_FS_TYPE:
    value_len = 2;
    if ((value != (void *)0x0) && (1 < local_70)) {
      *(short *)value = (short)face[1].num_fixed_sizes;
    }
    break;
  case PS_DICT_ITALIC_ANGLE:
    value_len = 8;
    if ((value != (void *)0x0) && (7 < local_70)) {
      *(FT_String **)value = face[1].family_name;
    }
  }
  if (value_len == 0) {
    local_90 = 0xffffffffffffffff;
  }
  else {
    local_90 = value_len;
  }
  return local_90;
}

Assistant:

static FT_Long
  t1_ps_get_font_value( FT_Face       face,
                        PS_Dict_Keys  key,
                        FT_UInt       idx,
                        void         *value,
                        FT_Long       value_len_ )
  {
    FT_ULong  retval    = 0; /* always >= 1 if valid */
    FT_ULong  value_len = value_len_ < 0 ? 0 : (FT_ULong)value_len_;

    T1_Face  t1face = (T1_Face)face;
    T1_Font  type1  = &t1face->type1;


    switch ( key )
    {
    case PS_DICT_FONT_TYPE:
      retval = sizeof ( type1->font_type );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->font_type;
      break;

    case PS_DICT_FONT_MATRIX:
      if ( idx < sizeof ( type1->font_matrix ) /
                   sizeof ( type1->font_matrix.xx ) )
      {
        FT_Fixed  val = 0;


        retval = sizeof ( val );
        if ( value && value_len >= retval )
        {
          switch ( idx )
          {
          case 0:
            val = type1->font_matrix.xx;
            break;
          case 1:
            val = type1->font_matrix.xy;
            break;
          case 2:
            val = type1->font_matrix.yx;
            break;
          case 3:
            val = type1->font_matrix.yy;
            break;
          }
          *((FT_Fixed *)value) = val;
        }
      }
      break;

    case PS_DICT_FONT_BBOX:
      if ( idx < sizeof ( type1->font_bbox ) /
                   sizeof ( type1->font_bbox.xMin ) )
      {
        FT_Fixed  val = 0;


        retval = sizeof ( val );
        if ( value && value_len >= retval )
        {
          switch ( idx )
          {
          case 0:
            val = type1->font_bbox.xMin;
            break;
          case 1:
            val = type1->font_bbox.yMin;
            break;
          case 2:
            val = type1->font_bbox.xMax;
            break;
          case 3:
            val = type1->font_bbox.yMax;
            break;
          }
          *((FT_Fixed *)value) = val;
        }
      }
      break;

    case PS_DICT_PAINT_TYPE:
      retval = sizeof ( type1->paint_type );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->paint_type;
      break;

    case PS_DICT_FONT_NAME:
      if ( type1->font_name )
      {
        retval = ft_strlen( type1->font_name ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_name ), retval );
      }
      break;

    case PS_DICT_UNIQUE_ID:
      retval = sizeof ( type1->private_dict.unique_id );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.unique_id;
      break;

    case PS_DICT_NUM_CHAR_STRINGS:
      retval = sizeof ( type1->num_glyphs );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->num_glyphs;
      break;

    case PS_DICT_CHAR_STRING_KEY:
      if ( idx < (FT_UInt)type1->num_glyphs )
      {
        retval = ft_strlen( type1->glyph_names[idx] ) + 1;
        if ( value && value_len >= retval )
        {
          ft_memcpy( value, (void *)( type1->glyph_names[idx] ), retval );
          ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
        }
      }
      break;

    case PS_DICT_CHAR_STRING:
      if ( idx < (FT_UInt)type1->num_glyphs )
      {
        retval = type1->charstrings_len[idx] + 1;
        if ( value && value_len >= retval )
        {
          ft_memcpy( value, (void *)( type1->charstrings[idx] ),
                     retval - 1 );
          ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
        }
      }
      break;

    case PS_DICT_ENCODING_TYPE:
      retval = sizeof ( type1->encoding_type );
      if ( value && value_len >= retval )
        *((T1_EncodingType *)value) = type1->encoding_type;
      break;

    case PS_DICT_ENCODING_ENTRY:
      if ( type1->encoding_type == T1_ENCODING_TYPE_ARRAY &&
           idx < (FT_UInt)type1->encoding.num_chars       )
      {
        retval = ft_strlen( type1->encoding.char_name[idx] ) + 1;
        if ( value && value_len >= retval )
        {
          ft_memcpy( value, (void *)( type1->encoding.char_name[idx] ),
                     retval - 1 );
          ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
        }
      }
      break;

    case PS_DICT_NUM_SUBRS:
      retval = sizeof ( type1->num_subrs );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->num_subrs;
      break;

    case PS_DICT_SUBR:
      {
        FT_Bool  ok = 0;


        if ( type1->subrs_hash )
        {
          /* convert subr index to array index */
          size_t*  val = ft_hash_num_lookup( (FT_Int)idx,
                                             type1->subrs_hash );


          if ( val )
          {
            idx = *val;
            ok  = 1;
          }
        }
        else
        {
          if ( idx < (FT_UInt)type1->num_subrs )
            ok = 1;
        }

        if ( ok && type1->subrs )
        {
          retval = type1->subrs_len[idx] + 1;
          if ( value && value_len >= retval )
          {
            ft_memcpy( value, (void *)( type1->subrs[idx] ), retval - 1 );
            ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
          }
        }
      }
      break;

    case PS_DICT_STD_HW:
      retval = sizeof ( type1->private_dict.standard_width[0] );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->private_dict.standard_width[0];
      break;

    case PS_DICT_STD_VW:
      retval = sizeof ( type1->private_dict.standard_height[0] );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->private_dict.standard_height[0];
      break;

    case PS_DICT_NUM_BLUE_VALUES:
      retval = sizeof ( type1->private_dict.num_blue_values );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_blue_values;
      break;

    case PS_DICT_BLUE_VALUE:
      if ( idx < type1->private_dict.num_blue_values )
      {
        retval = sizeof ( type1->private_dict.blue_values[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.blue_values[idx];
      }
      break;

    case PS_DICT_BLUE_SCALE:
      retval = sizeof ( type1->private_dict.blue_scale );
      if ( value && value_len >= retval )
        *((FT_Fixed *)value) = type1->private_dict.blue_scale;
      break;

    case PS_DICT_BLUE_FUZZ:
      retval = sizeof ( type1->private_dict.blue_fuzz );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.blue_fuzz;
      break;

    case PS_DICT_BLUE_SHIFT:
      retval = sizeof ( type1->private_dict.blue_shift );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.blue_shift;
      break;

    case PS_DICT_NUM_OTHER_BLUES:
      retval = sizeof ( type1->private_dict.num_other_blues );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_other_blues;
      break;

    case PS_DICT_OTHER_BLUE:
      if ( idx < type1->private_dict.num_other_blues )
      {
        retval = sizeof ( type1->private_dict.other_blues[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.other_blues[idx];
      }
      break;

    case PS_DICT_NUM_FAMILY_BLUES:
      retval = sizeof ( type1->private_dict.num_family_blues );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_family_blues;
      break;

    case PS_DICT_FAMILY_BLUE:
      if ( idx < type1->private_dict.num_family_blues )
      {
        retval = sizeof ( type1->private_dict.family_blues[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.family_blues[idx];
      }
      break;

    case PS_DICT_NUM_FAMILY_OTHER_BLUES:
      retval = sizeof ( type1->private_dict.num_family_other_blues );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_family_other_blues;
      break;

    case PS_DICT_FAMILY_OTHER_BLUE:
      if ( idx < type1->private_dict.num_family_other_blues )
      {
        retval = sizeof ( type1->private_dict.family_other_blues[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.family_other_blues[idx];
      }
      break;

    case PS_DICT_NUM_STEM_SNAP_H:
      retval = sizeof ( type1->private_dict.num_snap_widths );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_snap_widths;
      break;

    case PS_DICT_STEM_SNAP_H:
      if ( idx < type1->private_dict.num_snap_widths )
      {
        retval = sizeof ( type1->private_dict.snap_widths[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.snap_widths[idx];
      }
      break;

    case PS_DICT_NUM_STEM_SNAP_V:
      retval = sizeof ( type1->private_dict.num_snap_heights );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_snap_heights;
      break;

    case PS_DICT_STEM_SNAP_V:
      if ( idx < type1->private_dict.num_snap_heights )
      {
        retval = sizeof ( type1->private_dict.snap_heights[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.snap_heights[idx];
      }
      break;

    case PS_DICT_RND_STEM_UP:
      retval = sizeof ( type1->private_dict.round_stem_up );
      if ( value && value_len >= retval )
        *((FT_Bool *)value) = type1->private_dict.round_stem_up;
      break;

    case PS_DICT_FORCE_BOLD:
      retval = sizeof ( type1->private_dict.force_bold );
      if ( value && value_len >= retval )
        *((FT_Bool *)value) = type1->private_dict.force_bold;
      break;

    case PS_DICT_MIN_FEATURE:
      if ( idx < sizeof ( type1->private_dict.min_feature ) /
                   sizeof ( type1->private_dict.min_feature[0] ) )
      {
        retval = sizeof ( type1->private_dict.min_feature[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.min_feature[idx];
      }
      break;

    case PS_DICT_LEN_IV:
      retval = sizeof ( type1->private_dict.lenIV );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.lenIV;
      break;

    case PS_DICT_PASSWORD:
      retval = sizeof ( type1->private_dict.password );
      if ( value && value_len >= retval )
        *((FT_Long *)value) = type1->private_dict.password;
      break;

    case PS_DICT_LANGUAGE_GROUP:
      retval = sizeof ( type1->private_dict.language_group );
      if ( value && value_len >= retval )
        *((FT_Long *)value) = type1->private_dict.language_group;
      break;

    case PS_DICT_IS_FIXED_PITCH:
      retval = sizeof ( type1->font_info.is_fixed_pitch );
      if ( value && value_len >= retval )
        *((FT_Bool *)value) = type1->font_info.is_fixed_pitch;
      break;

    case PS_DICT_UNDERLINE_POSITION:
      retval = sizeof ( type1->font_info.underline_position );
      if ( value && value_len >= retval )
        *((FT_Short *)value) = type1->font_info.underline_position;
      break;

    case PS_DICT_UNDERLINE_THICKNESS:
      retval = sizeof ( type1->font_info.underline_thickness );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->font_info.underline_thickness;
      break;

    case PS_DICT_FS_TYPE:
      retval = sizeof ( type1->font_extra.fs_type );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->font_extra.fs_type;
      break;

    case PS_DICT_VERSION:
      if ( type1->font_info.version )
      {
        retval = ft_strlen( type1->font_info.version ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.version ), retval );
      }
      break;

    case PS_DICT_NOTICE:
      if ( type1->font_info.notice )
      {
        retval = ft_strlen( type1->font_info.notice ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.notice ), retval );
      }
      break;

    case PS_DICT_FULL_NAME:
      if ( type1->font_info.full_name )
      {
        retval = ft_strlen( type1->font_info.full_name ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.full_name ), retval );
      }
      break;

    case PS_DICT_FAMILY_NAME:
      if ( type1->font_info.family_name )
      {
        retval = ft_strlen( type1->font_info.family_name ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.family_name ),
                     retval );
      }
      break;

    case PS_DICT_WEIGHT:
      if ( type1->font_info.weight )
      {
        retval = ft_strlen( type1->font_info.weight ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.weight ), retval );
      }
      break;

    case PS_DICT_ITALIC_ANGLE:
      retval = sizeof ( type1->font_info.italic_angle );
      if ( value && value_len >= retval )
        *((FT_Long *)value) = type1->font_info.italic_angle;
      break;
    }

    return retval == 0 ? -1 : (FT_Long)retval;
  }